

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AS_02_PCM.cpp
# Opt level: O0

h__Reader * __thiscall
AS_02::PCM::MXFReader::h__Reader::OpenRead(h__Reader *this,string *filename,Rational *edit_rate)

{
  uchar *puVar1;
  bool bVar2;
  byte bVar3;
  int iVar4;
  ui32_t uVar5;
  char *__s;
  ILogSink *pIVar6;
  byte_t *pbVar7;
  long lVar8;
  undefined8 uVar9;
  ui64_t uVar10;
  int64_t iVar11;
  Rational *in_RCX;
  WaveAudioDescriptor *local_408;
  UL local_3a8;
  undefined1 local_388 [8];
  char buf [64];
  MDDEntry *entry;
  UL local_318;
  IFileReader local_2f8 [104];
  undefined1 local_290 [8];
  KLReader reader;
  undefined1 local_1c0 [208];
  long local_f0;
  InterchangeObject *tmp_obj;
  allocator<char> local_d1;
  string local_d0 [32];
  undefined1 local_b0 [8];
  Result_t result;
  IndexEntry local_48 [8];
  IndexEntry tmp_entry;
  undefined8 local_38;
  WaveAudioDescriptor *local_30;
  WaveAudioDescriptor *wave_descriptor;
  Rational *edit_rate_local;
  string *filename_local;
  h__Reader *this_local;
  
  local_30 = (WaveAudioDescriptor *)0x0;
  ASDCP::MXF::IndexTableSegment::IndexEntry::IndexEntry(local_48);
  __s = (char *)std::__cxx11::string::c_str();
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_d0,__s,&local_d1);
  h__AS02Reader::OpenMXFRead((h__AS02Reader *)local_b0,filename);
  std::__cxx11::string::~string(local_d0);
  std::allocator<char>::~allocator(&local_d1);
  iVar4 = Kumu::Result_t::operator_cast_to_int((Result_t *)local_b0);
  if (-1 < iVar4) {
    local_f0 = 0;
    ASDCP::Dictionary::Type((MDD_t)filename->_M_string_length);
    ASDCP::MXF::OP1aHeader::GetMDObjectByType
              (local_1c0 + 0x68,(InterchangeObject **)((long)&filename->field_2 + 8));
    iVar4 = Kumu::Result_t::operator_cast_to_int((Result_t *)(local_1c0 + 0x68));
    Kumu::Result_t::~Result_t((Result_t *)(local_1c0 + 0x68));
    if (-1 < iVar4) {
      if (local_f0 == 0) {
        local_408 = (WaveAudioDescriptor *)0x0;
      }
      else {
        local_408 = (WaveAudioDescriptor *)
                    __dynamic_cast(local_f0,&ASDCP::MXF::InterchangeObject::typeinfo,
                                   &ASDCP::MXF::WaveAudioDescriptor::typeinfo);
      }
      local_30 = local_408;
    }
  }
  if (local_30 == (WaveAudioDescriptor *)0x0) {
    pIVar6 = (ILogSink *)Kumu::DefaultLogSink();
    Kumu::ILogSink::Error(pIVar6,"WaveAudioDescriptor object not found.\n");
    Kumu::Result_t::operator=((Result_t *)local_b0,(Result_t *)RESULT_AS02_FORMAT);
  }
  iVar4 = Kumu::Result_t::operator_cast_to_int((Result_t *)local_b0);
  if (-1 < iVar4) {
    MXF::AS02IndexReader::Lookup
              ((AS02IndexReader *)local_1c0,(int)filename + 0x230,(IndexEntry *)0x0);
    Kumu::Result_t::operator=((Result_t *)local_b0,(Result_t *)local_1c0);
    Kumu::Result_t::~Result_t((Result_t *)local_1c0);
  }
  iVar4 = Kumu::Result_t::operator_cast_to_int((Result_t *)local_b0);
  if (-1 < iVar4) {
    (**(code **)(**(long **)&filename->field_2 + 0x28))
              (reader.m_KeyBuf + 0x18,*(long **)&filename->field_2,local_38);
    Kumu::Result_t::operator=((Result_t *)local_b0,(Result_t *)(reader.m_KeyBuf + 0x18));
    Kumu::Result_t::~Result_t((Result_t *)(reader.m_KeyBuf + 0x18));
  }
  iVar4 = Kumu::Result_t::operator_cast_to_int((Result_t *)local_b0);
  if (-1 < iVar4) {
    if (local_30 == (WaveAudioDescriptor *)0x0) {
      __assert_fail("wave_descriptor",
                    "/workspace/llm4binary/github/license_c_cmakelists/cinecert[P]asdcplib/src/AS_02_PCM.cpp"
                    ,0x65,
                    "ASDCP::Result_t AS_02::PCM::MXFReader::h__Reader::OpenRead(const std::string &, const ASDCP::Rational &)"
                   );
    }
    ASDCP::KLReader::KLReader((KLReader *)local_290);
    ASDCP::KLReader::ReadKLFromFile(local_2f8);
    Kumu::Result_t::operator=((Result_t *)local_b0,(Result_t *)local_2f8);
    Kumu::Result_t::~Result_t((Result_t *)local_2f8);
    iVar4 = Kumu::Result_t::operator_cast_to_int((Result_t *)local_b0);
    if (iVar4 < 0) {
LAB_0019d58f:
      bVar2 = false;
    }
    else {
      pbVar7 = ASDCP::KLReader::Key((KLReader *)local_290);
      ASDCP::UL::UL(&local_318,pbVar7);
      pbVar7 = ASDCP::Dictionary::ul((Dictionary *)filename->_M_string_length,MDD_WAVEssenceClip);
      ASDCP::UL::UL((UL *)&entry,pbVar7);
      bVar3 = ASDCP::UL::MatchIgnoreStream(&local_318);
      ASDCP::UL::~UL((UL *)&entry);
      ASDCP::UL::~UL(&local_318);
      if (((bVar3 ^ 0xff) & 1) == 0) {
        if (*(short *)(local_30 + 0x1b8) == 0) {
          pIVar6 = (ILogSink *)Kumu::DefaultLogSink();
          Kumu::ILogSink::Error
                    (pIVar6,"EssenceDescriptor has corrupt BlockAlign value, unable to continue.\n")
          ;
          Kumu::Result_t::Result_t((Result_t *)this,(Result_t *)RESULT_AS02_FORMAT);
          bVar2 = true;
        }
        else {
          uVar10 = ASDCP::KLReader::Length((KLReader *)local_290);
          if (uVar10 % (ulong)*(ushort *)(local_30 + 0x1b8) == 0) {
            iVar11 = Kumu::IFileReader::TellPosition
                               ((IFileReader *)(filename->field_2)._M_allocated_capacity);
            *(int64_t *)(filename + 0x28) = iVar11;
            uVar10 = ASDCP::KLReader::Length((KLReader *)local_290);
            filename[0x28]._M_string_length = uVar10;
            uVar5 = MXF::CalcFrameBufferSize(local_30,in_RCX);
            *(ui32_t *)((long)&filename[0x28].field_2 + 4) = uVar5;
            *(int *)&filename[0x28].field_2 =
                 (int)(filename[0x28]._M_string_length /
                      (ulong)*(uint *)((long)&filename[0x28].field_2 + 4));
            if (filename[0x28]._M_string_length %
                (ulong)*(uint *)((long)&filename[0x28].field_2 + 4) != 0) {
              *(int *)&filename[0x28].field_2 = *(int *)&filename[0x28].field_2 + 1;
            }
            goto LAB_0019d58f;
          }
          pIVar6 = (ILogSink *)Kumu::DefaultLogSink();
          Kumu::ILogSink::Error
                    (pIVar6,
                     "Clip length is not an even multiple of BlockAlign, unable to continue.\n");
          Kumu::Result_t::Result_t((Result_t *)this,(Result_t *)RESULT_AS02_FORMAT);
          bVar2 = true;
        }
      }
      else {
        puVar1 = (uchar *)filename->_M_string_length;
        ASDCP::KLReader::Key((KLReader *)local_290);
        lVar8 = ASDCP::Dictionary::FindULAnyVersion(puVar1);
        if (lVar8 == 0) {
          pIVar6 = (ILogSink *)Kumu::DefaultLogSink();
          pbVar7 = ASDCP::KLReader::Key((KLReader *)local_290);
          ASDCP::UL::UL(&local_3a8,pbVar7);
          uVar9 = ASDCP::UL::EncodeString((char *)&local_3a8,(uint)local_388);
          Kumu::ILogSink::Error(pIVar6,"Essence wrapper key is not WAVEssenceClip: %s\n",uVar9);
          ASDCP::UL::~UL(&local_3a8);
        }
        else {
          pIVar6 = (ILogSink *)Kumu::DefaultLogSink();
          Kumu::ILogSink::Error
                    (pIVar6,"Essence wrapper key is not WAVEssenceClip: %s\n",
                     *(undefined8 *)(lVar8 + 0x18));
        }
        Kumu::Result_t::Result_t((Result_t *)this,(Result_t *)RESULT_AS02_FORMAT);
        bVar2 = true;
      }
    }
    ASDCP::KLReader::~KLReader((KLReader *)local_290);
    if (bVar2) goto LAB_0019d5e0;
  }
  Kumu::Result_t::Result_t((Result_t *)this,(Result_t *)local_b0);
LAB_0019d5e0:
  Kumu::Result_t::~Result_t((Result_t *)local_b0);
  ASDCP::MXF::IndexTableSegment::IndexEntry::~IndexEntry(local_48);
  return this;
}

Assistant:

ASDCP::Result_t
AS_02::PCM::MXFReader::h__Reader::OpenRead(const std::string& filename, const ASDCP::Rational& edit_rate)
{
  ASDCP::MXF::WaveAudioDescriptor* wave_descriptor = 0;
  IndexTableSegment::IndexEntry tmp_entry;
  Result_t result = OpenMXFRead(filename.c_str());

  if( KM_SUCCESS(result) )
    {
      InterchangeObject* tmp_obj = 0;

      if ( KM_SUCCESS(m_HeaderPart.GetMDObjectByType(OBJ_TYPE_ARGS(WaveAudioDescriptor), &tmp_obj)) )
	{
	  wave_descriptor = dynamic_cast<ASDCP::MXF::WaveAudioDescriptor*>(tmp_obj);
	}
    }

  if ( wave_descriptor == 0 )
    {
      DefaultLogSink().Error("WaveAudioDescriptor object not found.\n");
      result = RESULT_AS02_FORMAT;
    }

  if ( KM_SUCCESS(result) )
    result = m_IndexAccess.Lookup(0, tmp_entry);

  if ( KM_SUCCESS(result) )
    result = m_File->Seek(tmp_entry.StreamOffset);

  if ( KM_SUCCESS(result) )
    {
      assert(wave_descriptor);
      KLReader reader;
      result = reader.ReadKLFromFile(*m_File);

      if ( KM_SUCCESS(result) )
	{
	  if ( ! UL(reader.Key()).MatchIgnoreStream(m_Dict->ul(MDD_WAVEssenceClip)) )
	    {
	      const MDDEntry *entry = m_Dict->FindULAnyVersion(reader.Key());

	      if ( entry == 0 )
		{
		  char buf[64];
		  DefaultLogSink().Error("Essence wrapper key is not WAVEssenceClip: %s\n", UL(reader.Key()).EncodeString(buf, 64));
		}
	      else
		{
		  DefaultLogSink().Error("Essence wrapper key is not WAVEssenceClip: %s\n", entry->name);
		}
	      
	      return RESULT_AS02_FORMAT;
	    }

	  if ( wave_descriptor->BlockAlign == 0 )
	    {
	      DefaultLogSink().Error("EssenceDescriptor has corrupt BlockAlign value, unable to continue.\n");
	      return RESULT_AS02_FORMAT;
	    }

	  if ( reader.Length() % wave_descriptor->BlockAlign != 0 )
	    {
	      DefaultLogSink().Error("Clip length is not an even multiple of BlockAlign, unable to continue.\n");
	      return RESULT_AS02_FORMAT;
	    }

	  m_ClipEssenceBegin = m_File->TellPosition();
	  m_ClipSize = reader.Length();
	  m_BytesPerFrame = AS_02::MXF::CalcFrameBufferSize(*wave_descriptor, edit_rate);
	  m_ClipDurationFrames = m_ClipSize / m_BytesPerFrame;

	  if ( m_ClipSize % m_BytesPerFrame > 0 )
	    {
	      ++m_ClipDurationFrames; // there is a partial frame at the end
	    }
	}
    }

  return result;
}